

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityMarking::GetEntityMarkingString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityMarking *this)

{
  allocator<char> local_19;
  EntityMarking *local_18;
  EntityMarking *this_local;
  
  local_18 = this;
  this_local = (EntityMarking *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,this->m_sEntityMarkingString,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

KString EntityMarking::GetEntityMarkingString() const
{
    return m_sEntityMarkingString;
}